

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::ReadRawBlockFromDisk
          (BlockManager *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *block,
          FlatFilePos *pos)

{
  long lVar1;
  pointer puVar2;
  bool bVar3;
  uint32_t uVar4;
  size_t __nbytes;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  uint blk_size;
  FlatFilePos hpos;
  MessageStartChars blk_start;
  string local_c0;
  string local_a0;
  string local_80;
  AutoFile filein;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hpos = *pos;
  if ((ulong)hpos >> 0x23 == 0) {
    FlatFilePos::ToString_abi_cxx11_((string *)&filein,pos);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x65;
    logging_function._M_str = "ReadRawBlockFromDisk";
    logging_function._M_len = 0x14;
    LogPrintFormatInternal<char[21],std::__cxx11::string>
              (logging_function,source_file,0x43b,ALL,Error,(ConstevalFormatString<2U>)0xc9e15b,
               (char (*) [21])"ReadRawBlockFromDisk",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filein);
    std::__cxx11::string::~string((string *)&filein);
    bVar3 = false;
    goto LAB_0075ec66;
  }
  hpos.nPos = hpos.nPos - 8;
  __nbytes = 1;
  OpenBlockFile(&filein,this,&hpos,true);
  if (filein.m_file == (FILE *)0x0) {
    FlatFilePos::ToString_abi_cxx11_(&local_80,pos);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_01._M_len = 0x65;
    logging_function_01._M_str = "ReadRawBlockFromDisk";
    logging_function_01._M_len = 0x14;
    LogPrintFormatInternal<char[21],std::__cxx11::string>
              (logging_function_01,source_file_01,0x441,ALL,Error,
               (ConstevalFormatString<2U>)0xc9e15b,(char (*) [21])"ReadRawBlockFromDisk",&local_80);
LAB_0075ec50:
    std::__cxx11::string::~string((string *)&local_80);
    bVar3 = false;
  }
  else {
    Unserialize<AutoFile,_unsigned_char,_4UL>(&filein,&blk_start);
    uVar4 = ser_readdata32<AutoFile>(&filein);
    blk_size = uVar4;
    bVar3 = std::operator==(&blk_start,&((this->m_opts).chainparams)->pchMessageStart);
    if (!bVar3) {
      FlatFilePos::ToString_abi_cxx11_(&local_80,pos);
      s.m_size = 4;
      s.m_data = blk_start._M_elems;
      HexStr_abi_cxx11_(&local_a0,s);
      s_00.m_data = &((this->m_opts).chainparams)->pchMessageStart;
      s_00.m_size = 4;
      HexStr_abi_cxx11_(&local_c0,s_00);
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_02._M_len = 0x65;
      logging_function_02._M_str = "ReadRawBlockFromDisk";
      logging_function_02._M_len = 0x14;
      LogPrintFormatInternal<char[21],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (logging_function_02,source_file_02,0x44e,ALL,Error,
                 (ConstevalFormatString<4U>)0xc9e207,(char (*) [21])"ReadRawBlockFromDisk",&local_80
                 ,&local_a0,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      goto LAB_0075ec50;
    }
    if (0x2000000 < uVar4) {
      FlatFilePos::ToString_abi_cxx11_(&local_80,pos);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_00._M_len = 0x65;
      logging_function_00._M_str = "ReadRawBlockFromDisk";
      logging_function_00._M_len = 0x14;
      LogPrintFormatInternal<char[21],std::__cxx11::string,unsigned_int,unsigned_long>
                (logging_function_00,source_file_00,0x454,ALL,Error,
                 (ConstevalFormatString<4U>)0xc9e23f,(char (*) [21])"ReadRawBlockFromDisk",&local_80
                 ,&blk_size,&MAX_SIZE);
      goto LAB_0075ec50;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(block,(ulong)uVar4);
    puVar2 = (block->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar3 = true;
    AutoFile::read(&filein,(int)puVar2,
                   (block->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish + -(long)puVar2,__nbytes);
  }
  AutoFile::~AutoFile(&filein);
LAB_0075ec66:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadRawBlockFromDisk(std::vector<uint8_t>& block, const FlatFilePos& pos) const
{
    FlatFilePos hpos = pos;
    // If nPos is less than 8 the pos is null and we don't have the block data
    // Return early to prevent undefined behavior of unsigned int underflow
    if (hpos.nPos < 8) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }
    hpos.nPos -= 8; // Seek back 8 bytes for meta header
    AutoFile filein{OpenBlockFile(hpos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    try {
        MessageStartChars blk_start;
        unsigned int blk_size;

        filein >> blk_start >> blk_size;

        if (blk_start != GetParams().MessageStart()) {
            LogError("%s: Block magic mismatch for %s: %s versus expected %s\n", __func__, pos.ToString(),
                         HexStr(blk_start),
                         HexStr(GetParams().MessageStart()));
            return false;
        }

        if (blk_size > MAX_SIZE) {
            LogError("%s: Block data is larger than maximum deserialization size for %s: %s versus %s\n", __func__, pos.ToString(),
                         blk_size, MAX_SIZE);
            return false;
        }

        block.resize(blk_size); // Zeroing of memory is intentional here
        filein.read(MakeWritableByteSpan(block));
    } catch (const std::exception& e) {
        LogError("%s: Read from block file failed: %s for %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    return true;
}